

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

bool millisInSystemRange(qint64 millis,qint64 slack)

{
  bool bVar1;
  int iVar2;
  
  if (millisInSystemRange(long_long,long_long)::bounds == '\0') {
    iVar2 = __cxa_guard_acquire(&millisInSystemRange(long_long,long_long)::bounds);
    if (iVar2 != 0) {
      QLocalTime::computeSystemMillisRange();
      __cxa_guard_release(&millisInSystemRange(long_long,long_long)::bounds);
    }
  }
  if ((millisInSystemRange::bounds.minClip == false) &&
     (millis < millisInSystemRange::bounds.min - slack)) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (millisInSystemRange::bounds.maxClip == false) {
      bVar1 = millis <= slack + millisInSystemRange::bounds.max;
    }
  }
  return bVar1;
}

Assistant:

static inline bool millisInSystemRange(qint64 millis, qint64 slack = 0)
{
    static const auto bounds = QLocalTime::computeSystemMillisRange();
    return (bounds.minClip || millis >= bounds.min - slack)
        && (bounds.maxClip || millis <= bounds.max + slack);
}